

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O3

ngx_buf_t * ngx_create_temp_buf(ngx_pool_t *pool,size_t size)

{
  ngx_buf_t *pnVar1;
  u_char *puVar2;
  
  pnVar1 = (ngx_buf_t *)ngx_pcalloc(pool,0x50);
  if (pnVar1 != (ngx_buf_t *)0x0) {
    puVar2 = (u_char *)ngx_palloc(pool,size);
    pnVar1->start = puVar2;
    if (puVar2 != (u_char *)0x0) {
      pnVar1->pos = puVar2;
      pnVar1->last = puVar2;
      pnVar1->end = puVar2 + size;
      pnVar1->field_0x48 = pnVar1->field_0x48 | 1;
      return pnVar1;
    }
  }
  return (ngx_buf_t *)0x0;
}

Assistant:

ngx_buf_t *
ngx_create_temp_buf(ngx_pool_t *pool, size_t size)
{
    ngx_buf_t *b;

    b = ngx_calloc_buf(pool);
    if (b == NULL) {
        return NULL;
    }

    b->start = ngx_palloc(pool, size);
    if (b->start == NULL) {
        return NULL;
    }

    /*
     * set by ngx_calloc_buf():
     *
     *     b->file_pos = 0;
     *     b->file_last = 0;
     *     b->file = NULL;
     *     b->shadow = NULL;
     *     b->tag = 0;
     *     and flags
     */

    b->pos = b->start;
    b->last = b->start;
    b->end = b->last + size;
    b->temporary = 1;

    return b;
}